

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O2

int descriptionToType(string *des)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = std::operator==(des,"Alchitry Cu A");
  if (bVar1) {
    uVar2 = 2;
  }
  else {
    bVar1 = std::operator==(des,"Alchitry Au A");
    uVar2 = 0;
    if (!bVar1) {
      bVar1 = std::operator==(des,"Alchitry Au+ A");
      uVar2 = bVar1 - 1 | 1;
    }
  }
  return uVar2;
}

Assistant:

int descriptionToType(const string &des) {
    if (des == "Alchitry Cu A") {
        return BOARD_CU;
    } else if (des == "Alchitry Au A") {
        return BOARD_AU;
    } else if (des == "Alchitry Au+ A") {
        return BOARD_AU_PLUS;
    } else {
        return BOARD_UNKNOWN;
    }
}